

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool dumpKeyPresses<short>(string *fname,TKeyPressCollectionT<short> *data)

{
  pointer psVar1;
  ostream *poVar2;
  stKeyPressData<short> *k;
  pointer psVar3;
  ofstream fout;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,(string *)fname,_S_out);
  psVar1 = (data->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
           super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (data->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
                .super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    poVar2 = std::ostream::_M_insert<long>((long)&local_228);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," 1",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  std::ofstream::close();
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return true;
}

Assistant:

bool dumpKeyPresses(const std::string & fname, const TKeyPressCollectionT<T> & data) {
    std::ofstream fout(fname);
    for (auto & k : data) {
        fout << k.pos << " 1" << std::endl;
    }
    fout.close();
    return true;
}